

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

uint64_t uv__read_uint64(char *filename)

{
  int iVar1;
  uint64_t rc;
  char buf [32];
  uint64_t local_30;
  int local_28;
  char local_24;
  
  local_30 = 0;
  iVar1 = uv__slurp(filename,(char *)&local_28,0x20);
  if (iVar1 == 0) {
    iVar1 = sscanf((char *)&local_28,"%lu",&local_30);
    if ((iVar1 != 1) && (local_24 == '\0' && local_28 == 0xa78616d)) {
      local_30 = 0xffffffffffffffff;
    }
  }
  return local_30;
}

Assistant:

static uint64_t uv__read_uint64(const char* filename) {
  char buf[32];  /* Large enough to hold an encoded uint64_t. */
  uint64_t rc;

  rc = 0;
  if (0 == uv__slurp(filename, buf, sizeof(buf)))
    if (1 != sscanf(buf, "%" PRIu64, &rc))
      if (0 == strcmp(buf, "max\n"))
        rc = UINT64_MAX;

  return rc;
}